

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

const_reference __thiscall
duckdb::vector<duckdb::CatalogSearchEntry,_true>::operator[]
          (vector<duckdb::CatalogSearchEntry,_true> *this,size_type __n)

{
  const_reference pvVar1;
  size_type in_RDI;
  vector<duckdb::CatalogSearchEntry,_true> *unaff_retaddr;
  
  pvVar1 = get<true>(unaff_retaddr,in_RDI);
  return pvVar1;
}

Assistant:

typename original::const_reference operator[](typename original::size_type __n) const { // NOLINT: hiding on purpose
		return get<SAFE>(__n);
	}